

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O3

string * __thiscall
Diligent::FormatString<char[39],int,char[2],int,char[2],char_const*,char[106]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [39],int *Args_1,
          char (*Args_2) [2],int *Args_3,char (*Args_4) [2],char **Args_5,char (*Args_6) [106])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[39],int,char[2],int,char[2],char_const*,char[106]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [39])this,(int *)Args,(char (*) [2])Args_1,(int *)Args_2,(char (*) [2])Args_3
             ,(char **)Args_4,(char (*) [106])Args_5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}